

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O2

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
VisitNumericConstant
          (ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
           *this,NumericConstant c)

{
  fmt::BasicWriter<char>::operator<<
            (this->writer_,
             *(double *)
              ((long)c.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_ +
              8));
  return;
}

Assistant:

void VisitNumericConstant(NumericConstant c) { writer_ << c.value(); }